

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<duckdb::HivePartitioningIndex>
          (Serializer *this,vector<duckdb::HivePartitioningIndex,_true> *vec)

{
  pointer pHVar1;
  long lVar2;
  HivePartitioningIndex *item;
  pointer value;
  
  lVar2 = (long)(vec->
                super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                ).
                super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(vec->
                super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                ).
                super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (*this->_vptr_Serializer[8])(this,lVar2 / 0x28,lVar2 % 0x28);
  pHVar1 = (vec->
           super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
           ).
           super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (value = (vec->
               super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
               ).
               super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
               ._M_impl.super__Vector_impl_data._M_start; value != pHVar1; value = value + 1) {
    WriteValue<duckdb::HivePartitioningIndex>(this,value);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}